

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

int LogLuvInitState(TIFF *tif)

{
  uint16_t uVar1;
  uint8_t *puVar2;
  uint uVar3;
  tmsize_t tVar4;
  void *pvVar5;
  uint uVar6;
  ulong m2;
  ulong m1;
  char *fmt;
  
  puVar2 = tif->tif_data;
  if (puVar2 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x5ac,"int LogLuvInitState(TIFF *)");
  }
  if ((tif->tif_dir).td_photometric != 0x804d) {
    __assert_fail("td->td_photometric == PHOTOMETRIC_LOGLUV",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x5ad,"int LogLuvInitState(TIFF *)");
  }
  if ((tif->tif_dir).td_planarconfig != 1) {
    fmt = "SGILog compression cannot handle non-contiguous data";
    goto LAB_00262ff7;
  }
  uVar3 = *(uint *)(puVar2 + 4);
  if (uVar3 == 0xffffffff) {
    uVar6 = (uint)(tif->tif_dir).td_sampleformat | (uint)(tif->tif_dir).td_bitspersample << 3;
    uVar3 = 0xffffffff;
    if ((uVar6 - 0x81 < 4) && (uVar6 - 0x81 != 2)) {
      uVar6 = 1;
    }
    else if (uVar6 - 0x101 < 2) {
LAB_00262f41:
      uVar3 = 2;
      uVar6 = 0xffffffff;
    }
    else if ((uVar6 == 0x41) || (uVar6 == 0x44)) {
      uVar6 = 3;
    }
    else if (uVar6 == 0x103) {
      uVar6 = 0;
    }
    else {
      if (uVar6 == 0x104) goto LAB_00262f41;
      uVar3 = 0xffffffff;
      uVar6 = uVar3;
    }
    uVar1 = (tif->tif_dir).td_samplesperpixel;
    if ((uVar1 != 1) && (uVar3 = uVar6, uVar1 != 3)) {
      uVar3 = 0xffffffff;
    }
    *(uint *)(puVar2 + 4) = uVar3;
  }
  if (uVar3 < 4) {
    *(undefined4 *)(puVar2 + 0xc) = *(undefined4 *)(&DAT_002e85e0 + (ulong)uVar3 * 4);
    if ((tif->tif_flags & 0x400) == 0) {
      uVar3 = (tif->tif_dir).td_rowsperstrip;
      m1 = (ulong)(tif->tif_dir).td_imagewidth;
      uVar6 = (tif->tif_dir).td_imagelength;
      m2 = (ulong)uVar3;
      if (uVar6 <= uVar3) {
        m2 = (ulong)uVar6;
      }
    }
    else {
      m1 = (ulong)(tif->tif_dir).td_tilewidth;
      m2 = (ulong)(tif->tif_dir).td_tilelength;
    }
    tVar4 = multiply_ms(m1,m2);
    *(tmsize_t *)(puVar2 + 0x18) = tVar4;
    tVar4 = multiply_ms(tVar4,4);
    fmt = "No space for SGILog translation buffer";
    if (tVar4 != 0) {
      pvVar5 = _TIFFmallocExt(tif,*(long *)(puVar2 + 0x18) << 2);
      *(void **)(puVar2 + 0x10) = pvVar5;
      if (pvVar5 != (void *)0x0) {
        return 1;
      }
    }
  }
  else {
    fmt = "No support for converting user data format to LogLuv";
  }
LAB_00262ff7:
  TIFFErrorExtR(tif,"LogLuvInitState",fmt);
  return 0;
}

Assistant:

static int LogLuvInitState(TIFF *tif)
{
    static const char module[] = "LogLuvInitState";
    TIFFDirectory *td = &tif->tif_dir;
    LogLuvState *sp = DecoderState(tif);

    assert(sp != NULL);
    assert(td->td_photometric == PHOTOMETRIC_LOGLUV);

    /* for some reason, we can't do this in TIFFInitLogLuv */
    if (td->td_planarconfig != PLANARCONFIG_CONTIG)
    {
        TIFFErrorExtR(tif, module,
                      "SGILog compression cannot handle non-contiguous data");
        return (0);
    }
    if (sp->user_datafmt == SGILOGDATAFMT_UNKNOWN)
        sp->user_datafmt = LogLuvGuessDataFmt(td);
    switch (sp->user_datafmt)
    {
        case SGILOGDATAFMT_FLOAT:
            sp->pixel_size = 3 * sizeof(float);
            break;
        case SGILOGDATAFMT_16BIT:
            sp->pixel_size = 3 * sizeof(int16_t);
            break;
        case SGILOGDATAFMT_RAW:
            sp->pixel_size = sizeof(uint32_t);
            break;
        case SGILOGDATAFMT_8BIT:
            sp->pixel_size = 3 * sizeof(uint8_t);
            break;
        default:
            TIFFErrorExtR(
                tif, module,
                "No support for converting user data format to LogLuv");
            return (0);
    }
    if (isTiled(tif))
        sp->tbuflen = multiply_ms(td->td_tilewidth, td->td_tilelength);
    else if (td->td_rowsperstrip < td->td_imagelength)
        sp->tbuflen = multiply_ms(td->td_imagewidth, td->td_rowsperstrip);
    else
        sp->tbuflen = multiply_ms(td->td_imagewidth, td->td_imagelength);
    if (multiply_ms(sp->tbuflen, sizeof(uint32_t)) == 0 ||
        (sp->tbuf = (uint8_t *)_TIFFmallocExt(
             tif, sp->tbuflen * sizeof(uint32_t))) == NULL)
    {
        TIFFErrorExtR(tif, module, "No space for SGILog translation buffer");
        return (0);
    }
    return (1);
}